

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  ImGuiWindow *this;
  byte in_SIL;
  uint in_EDI;
  ImGuiWindow *window;
  int *in_stack_ffffffffffffffe8;
  
  this = GetCurrentWindow();
  if ((in_SIL & 1) == 0) {
    (this->DC).ItemFlags = (in_EDI ^ 0xffffffff) & (this->DC).ItemFlags;
  }
  else {
    (this->DC).ItemFlags = in_EDI | (this->DC).ItemFlags;
  }
  ImVector<int>::push_back((ImVector<int> *)this,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (enabled)
        window->DC.ItemFlags |= option;
    else
        window->DC.ItemFlags &= ~option;
    window->DC.ItemFlagsStack.push_back(window->DC.ItemFlags);
}